

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.h
# Opt level: O2

vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> * __thiscall
HighsImplications::getImplications(HighsImplications *this,HighsInt col,bool val,bool *infeasible)

{
  bool bVar1;
  int iVar2;
  pointer pIVar3;
  undefined7 in_register_00000011;
  
  iVar2 = (int)CONCAT71(in_register_00000011,val) + col * 2;
  pIVar3 = (this->implications).
           super__Vector_base<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pIVar3[iVar2].computed == false) {
    bVar1 = computeImplications(this,col,val);
    pIVar3 = (this->implications).
             super__Vector_base<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    bVar1 = false;
  }
  *infeasible = bVar1;
  return &pIVar3[iVar2].implics;
}

Assistant:

const std::vector<HighsDomainChange>& getImplications(HighsInt col, bool val,
                                                        bool& infeasible) {
    HighsInt loc = 2 * col + val;
    if (!implications[loc].computed)
      infeasible = computeImplications(col, val);
    else
      infeasible = false;

    assert(implications[loc].computed);

    return implications[loc].implics;
  }